

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_meshb_cell_bcast
          (REF_CELL ref_cell,REF_GLOB ncell,REF_NODE ref_node,REF_INT version,FILE *file)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  REF_MPI ref_mpi;
  bool bVar5;
  uint uVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  void *data;
  void *__ptr;
  void *__ptr_00;
  size_t sVar9;
  long lVar10;
  void *pvVar11;
  size_t __n;
  void *pvVar12;
  undefined8 uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  REF_INT local;
  REF_INT new_cell;
  REF_INT nodes [27];
  uint local_164;
  ulong local_158;
  int local_10c;
  FILE *local_108;
  REF_NODE local_100;
  long local_f8;
  REF_GLOB local_f0;
  void *local_e8;
  long local_e0;
  REF_CELL local_d8;
  size_t local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  REF_INT local_ac [31];
  
  ref_mpi = ref_node->ref_mpi;
  uVar8 = ncell / (long)ref_mpi->n;
  uVar15 = 1000000;
  if (1000000 < (long)uVar8) {
    uVar15 = uVar8;
  }
  uVar3 = ref_cell->size_per;
  iVar14 = (int)uVar15;
  local_100 = ref_node;
  if ((int)(uVar3 * iVar14) < 0) {
    pcVar19 = "malloc c2n of REF_GLOB negative";
    uVar13 = 0x275;
LAB_001fb3a4:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
           "ref_part_meshb_cell_bcast",pcVar19);
    RVar7 = 1;
  }
  else {
    uVar4 = ref_cell->node_per;
    lVar22 = (long)(int)uVar4;
    local_108 = (FILE *)file;
    data = malloc((ulong)(uVar3 * iVar14) << 3);
    if (data == (void *)0x0) {
      pcVar19 = "malloc c2n of REF_GLOB NULL";
      uVar13 = 0x275;
    }
    else {
      lVar23 = lVar22 + 1;
      uVar6 = (int)lVar23 * iVar14;
      if ((int)uVar6 < 0) {
        pcVar19 = "malloc c2n_int of REF_INT negative";
        uVar13 = 0x276;
        goto LAB_001fb3a4;
      }
      __ptr = malloc((ulong)uVar6 * 4);
      if (__ptr == (void *)0x0) {
        pcVar19 = "malloc c2n_int of REF_INT NULL";
        uVar13 = 0x276;
      }
      else {
        __ptr_00 = malloc((ulong)uVar6 << 3);
        if (__ptr_00 != (void *)0x0) {
          local_d8 = ref_cell;
          if (0 < ncell) {
            uVar16 = (ulong)uVar4;
            local_d0 = (ulong)uVar3 * 8;
            local_e8 = (void *)((long)data + lVar22 * 8);
            lVar2 = (long)(int)uVar3 * 8;
            local_c0 = lVar23 * 4;
            uVar8 = -uVar16;
            lVar10 = 0;
            local_f8 = lVar23;
            local_f0 = ncell;
            local_b8 = uVar8;
            do {
              uVar6 = (int)local_f0 - (int)lVar10;
              uVar25 = (ulong)uVar6;
              if (iVar14 < (int)uVar6) {
                uVar25 = uVar15 & 0xffffffff;
              }
              iVar24 = (int)uVar25;
              local_e0 = lVar10;
              if (ref_mpi->id == 0) {
                iVar21 = (int)local_f8;
                __n = (size_t)(iVar24 * iVar21);
                if (version < 4) {
                  sVar9 = fread(__ptr,4,__n,local_108);
                  if (sVar9 != __n) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x27f,"ref_part_meshb_cell_bcast","int c2n",__n,sVar9);
                    return 1;
                  }
                  if (0 < iVar24) {
                    uVar17 = 0;
                    pvVar11 = __ptr;
                    pvVar12 = data;
                    do {
                      if (0 < (int)uVar3) {
                        uVar18 = 0;
                        do {
                          *(long *)((long)pvVar12 + uVar18 * 8) =
                               (long)*(int *)((long)pvVar11 + uVar18 * 4);
                          uVar18 = uVar18 + 1;
                        } while (uVar3 != uVar18);
                      }
                      uVar17 = uVar17 + 1;
                      pvVar12 = (void *)((long)pvVar12 + lVar2);
                      pvVar11 = (void *)((long)pvVar11 + local_c0);
                    } while (uVar17 != uVar25);
                  }
                }
                else {
                  sVar9 = fread(__ptr_00,8,__n,local_108);
                  if (sVar9 != __n) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x285,"ref_part_meshb_cell_bcast","long c2n",__n,sVar9);
                    return 1;
                  }
                  if (0 < iVar24) {
                    uVar18 = 0;
                    iVar20 = 0;
                    uVar17 = uVar25;
                    do {
                      if (0 < (int)uVar3) {
                        memcpy((void *)((long)data + uVar18 * 8),
                               (void *)((long)__ptr_00 + (long)iVar20 * 8),local_d0);
                      }
                      iVar20 = iVar20 + iVar21;
                      uVar18 = (ulong)((int)uVar18 + uVar3);
                      uVar17 = uVar17 - 1;
                    } while (uVar17 != 0);
                  }
                }
                if (0 < iVar24) {
                  uVar17 = 0;
                  pvVar11 = data;
                  do {
                    if (0 < (int)uVar4) {
                      uVar18 = 0;
                      do {
                        plVar1 = (long *)((long)pvVar11 + uVar18 * 8);
                        *plVar1 = *plVar1 + -1;
                        uVar18 = uVar18 + 1;
                      } while (uVar16 != uVar18);
                    }
                    uVar17 = uVar17 + 1;
                    pvVar11 = (void *)((long)pvVar11 + lVar2);
                  } while (uVar17 != uVar25);
                }
              }
              uVar6 = ref_mpi_bcast(ref_mpi,data,iVar24 * uVar3,2);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x28f,"ref_part_meshb_cell_bcast",(ulong)uVar6,"broadcast read c2n");
                return uVar6;
              }
              uVar8 = uVar8 & 0xffffffff;
              if (0 < iVar24) {
                local_158 = 0;
                pvVar11 = data;
                local_c8 = uVar25;
                do {
                  local_164 = (uint)uVar8;
                  bVar26 = 0 < (int)uVar4;
                  if (0 < (int)uVar4) {
                    lVar23 = 1;
                    do {
                      uVar6 = ref_node_local(local_100,
                                             *(REF_GLOB *)((long)pvVar11 + lVar23 * 8 + -8),
                                             &local_10c);
                      if ((uVar6 != 0) && (uVar6 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x296,"ref_part_meshb_cell_bcast",(ulong)uVar6,"local");
                        local_164 = uVar6;
                      }
                      if ((uVar6 != 5) && (uVar6 != 0)) {
                        return local_164;
                      }
                      if (local_10c == -1) break;
                      local_ac[lVar23] = local_10c;
                      bVar26 = lVar23 < lVar22;
                      lVar10 = local_b8 + lVar23;
                      lVar23 = lVar23 + 1;
                    } while (lVar10 != 0);
                  }
                  if (bVar26) {
LAB_001fb1e6:
                    uVar8 = (ulong)local_164;
                  }
                  else {
                    uVar8 = (ulong)local_164;
                    if (uVar4 != uVar3) {
                      local_ac[lVar22 + 1] =
                           *(REF_INT *)((long)local_e8 + local_158 * (long)(int)uVar3 * 8);
                    }
                    if (0 < (int)uVar4) {
                      uVar8 = 0;
                      bVar26 = false;
                      do {
                        bVar5 = !bVar26;
                        bVar26 = true;
                        if (bVar5) {
                          bVar26 = local_100->ref_mpi->id == local_100->part[local_ac[uVar8 + 1]];
                        }
                        uVar8 = uVar8 + 1;
                      } while (uVar16 != uVar8);
                      if (!bVar26) goto LAB_001fb1e6;
                      uVar6 = ref_cell_add(local_d8,local_ac + 1,local_ac);
                      if (uVar6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x2a7,"ref_part_meshb_cell_bcast",(ulong)uVar6,"add");
                        local_164 = uVar6;
                      }
                      uVar8 = (ulong)local_164;
                      if (uVar6 != 0) {
                        return local_164;
                      }
                    }
                  }
                  local_158 = local_158 + 1;
                  pvVar11 = (void *)((long)pvVar11 + lVar2);
                } while (local_158 != local_c8);
              }
              lVar10 = local_e0 + iVar24;
            } while (lVar10 < local_f0);
          }
          free(__ptr_00);
          free(__ptr);
          free(data);
          return 0;
        }
        pcVar19 = "malloc c2n_long of REF_LONG NULL";
        uVar13 = 0x277;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
           "ref_part_meshb_cell_bcast",pcVar19);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell_bcast(REF_CELL ref_cell,
                                                    REF_GLOB ncell,
                                                    REF_NODE ref_node,
                                                    REF_INT version,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB ncell_read;
  REF_INT chunk;
  REF_INT section_size;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_INT node_per, size_per;
  REF_INT cell, node, local, new_cell;
  REF_BOOL have_all_nodes, one_node_local;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(c2n, size_per * chunk, REF_GLOB);
  ref_malloc(c2n_int, (1 + node_per) * chunk, REF_INT);
  ref_malloc(c2n_long, (1 + node_per) * chunk, REF_LONG);

  ncell_read = 0;
  while (ncell_read < ncell) {
    section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
    if (ref_mpi_once(ref_mpi)) {
      nread = (size_t)(section_size * (1 + node_per));
      if (version < 4) {
        REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file), "long c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, c2n, size_per * section_size, REF_GLOB_TYPE),
        "broadcast read c2n");

    /* convert to local nodes and add if local */
    for (cell = 0; cell < section_size; cell++) {
      have_all_nodes = REF_TRUE;
      for (node = 0; node < node_per; node++) {
        RXS(ref_node_local(ref_node, c2n[node + size_per * cell], &local),
            REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          nodes[node] = local;
        } else {
          have_all_nodes = REF_FALSE;
          break;
        }
      }
      if (have_all_nodes) {
        if (node_per != size_per)
          nodes[node_per] = (REF_INT)c2n[node_per + size_per * cell];
        one_node_local = REF_FALSE;
        for (node = 0; node < node_per; node++) {
          one_node_local =
              (one_node_local || ref_node_owned(ref_node, nodes[node]));
        }
        if (one_node_local)
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");
      }
    }

    ncell_read += section_size;
  }

  free(c2n_long);
  free(c2n_int);
  free(c2n);

  return REF_SUCCESS;
}